

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.c
# Opt level: O2

void modules_unregister(translation_module_t *modules,translation_module_t *module)

{
  translation_module_t *tmp;
  translation_module_t *ptVar1;
  
  do {
    ptVar1 = modules;
    modules = ptVar1->next;
    if (modules == (translation_module_t *)0x0) {
      return;
    }
  } while (modules != module);
  ptVar1->next = module->next;
  return;
}

Assistant:

void modules_unregister(translation_module_t *modules, translation_module_t *module) {
	translation_module_t *tmp = modules;
	while ( tmp->next != NULL ) {
		if ( tmp->next == module ) {
			tmp->next = module->next;
			break;
		}
		tmp = tmp->next;
	}
}